

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_CEDate.cpp
# Opt level: O3

bool __thiscall test_CEDate::test_Gregorian(test_CEDate *this)

{
  CEDate *this_00;
  CEDate *this_01;
  double date;
  undefined1 uVar1;
  int iVar2;
  reference pvVar3;
  initializer_list<double> __l;
  double test_jd;
  double test_mjd;
  vector<double,_std::allocator<double>_> greg_vec;
  vector<double,_std::allocator<double>_> greg_vec2;
  double test_greg;
  CEDate test1;
  allocator local_1a9;
  double local_1a8;
  double local_1a0;
  vector<double,_std::allocator<double>_> local_198;
  undefined8 uStack_180;
  double local_178;
  vector<double,_std::allocator<double>_> local_170;
  vector<double,_std::allocator<double>_> local_158;
  undefined8 local_140;
  undefined4 local_134;
  CEDate local_130;
  double local_f0;
  double local_e8;
  vector<double,_std::allocator<double>_> local_e0;
  vector<double,_std::allocator<double>_> local_c8;
  vector<double,_std::allocator<double>_> local_b0;
  vector<double,_std::allocator<double>_> local_98;
  vector<double,_std::allocator<double>_> local_80;
  vector<double,_std::allocator<double>_> local_68;
  vector<double,_std::allocator<double>_> local_50;
  vector<double,_std::allocator<double>_> local_38;
  
  this_00 = &this->test_date_;
  this_01 = &this->base_date_;
  local_130._vptr_CEDate = (_func_int **)CEDate::Gregorian(this_01);
  local_198.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)CONCAT44(local_198.super__Vector_base<double,_std::allocator<double>_>._M_impl
                               .super__Vector_impl_data._M_start._4_4_,2);
  CEDate::SetDate(this_00,(double *)&local_130,(CEDateType *)&local_198);
  local_198.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)CEDate::Gregorian(this_00);
  local_170.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)CEDate::Gregorian(this_01);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_130,"test_Gregorian",(allocator *)&local_1a8);
  local_158.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start._0_4_ = 0x7d;
  (**(code **)(*(long *)this + 0x58))(this,&local_198,&local_170,&local_130);
  std::__cxx11::string::~string((string *)&local_130);
  __gnu_cxx::new_allocator<char>::~new_allocator((new_allocator<char> *)&local_1a8);
  iVar2 = CEDate::Year(this_00);
  local_198.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start._0_4_ = iVar2;
  iVar2 = CEDate::Year(this_01);
  local_170.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start._0_4_ = iVar2;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_130,"test_Gregorian",(allocator *)&local_1a8);
  local_158.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start._0_4_ = 0x80;
  (**(code **)(*(long *)this + 0x60))(this,&local_198,&local_170,&local_130);
  std::__cxx11::string::~string((string *)&local_130);
  __gnu_cxx::new_allocator<char>::~new_allocator((new_allocator<char> *)&local_1a8);
  local_198.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start._0_4_ = CEDate::Month(this_00);
  local_170.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start._0_4_ = CEDate::Month(this_01);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_130,"test_Gregorian",(allocator *)&local_1a8);
  local_158.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start._0_4_ = 0x81;
  (**(code **)(*(long *)this + 0x60))(this,&local_198,&local_170,&local_130);
  std::__cxx11::string::~string((string *)&local_130);
  __gnu_cxx::new_allocator<char>::~new_allocator((new_allocator<char> *)&local_1a8);
  iVar2 = CEDate::Day(this_00);
  local_198.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)CONCAT44(local_198.super__Vector_base<double,_std::allocator<double>_>._M_impl
                               .super__Vector_impl_data._M_start._4_4_,iVar2);
  iVar2 = CEDate::Day(this_01);
  local_170.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)CONCAT44(local_170.super__Vector_base<double,_std::allocator<double>_>._M_impl
                               .super__Vector_impl_data._M_start._4_4_,iVar2);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_130,"test_Gregorian",(allocator *)&local_1a8);
  local_158.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start._0_4_ = 0x82;
  (**(code **)(*(long *)this + 0x60))(this,&local_198,&local_170,&local_130);
  std::__cxx11::string::~string((string *)&local_130);
  __gnu_cxx::new_allocator<char>::~new_allocator((new_allocator<char> *)&local_1a8);
  local_198.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)CEDate::DayFraction(this_00);
  local_170.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)CEDate::DayFraction(this_01);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_130,"test_Gregorian",(allocator *)&local_1a8);
  local_158.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start._0_4_ = 0x83;
  (**(code **)(*(long *)this + 0x58))(this,&local_198,&local_170,&local_130);
  std::__cxx11::string::~string((string *)&local_130);
  __gnu_cxx::new_allocator<char>::~new_allocator((new_allocator<char> *)&local_1a8);
  CEDate::GregorianVect(&local_198,this_00);
  CEDate::GregorianVect(&local_170,this_01);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_130,"test_Gregorian",(allocator *)&local_1a8);
  local_158.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start._0_4_ = 0x86;
  CETestSuite::test_vect((vector *)this,(vector *)&local_198,(string *)&local_170,(int *)&local_130)
  ;
  std::__cxx11::string::~string((string *)&local_130);
  __gnu_cxx::new_allocator<char>::~new_allocator((new_allocator<char> *)&local_1a8);
  std::vector<double,_std::allocator<double>_>::~vector(&local_170);
  std::vector<double,_std::allocator<double>_>::~vector(&local_198);
  CEDate::GregorianVect(&local_170,this_01);
  date = CEDate::CurrentJD();
  CEDate::CEDate(&local_130,date,JD);
  local_e8 = CEDate::JD(&local_130);
  local_f0 = CEDate::JD(this_01);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_198,"test_Gregorian",(allocator *)&local_1a8);
  local_158.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start._0_4_ = 0x8b;
  (**(code **)(*(long *)this + 0x48))(this,-(local_e8 != local_f0) & 1,&local_198);
  std::__cxx11::string::~string((string *)&local_198);
  __gnu_cxx::new_allocator<char>::~new_allocator((new_allocator<char> *)&local_1a8);
  std::vector<double,_std::allocator<double>_>::vector(&local_38,&local_170);
  CEDate::SetDate(&local_130,&local_38);
  std::vector<double,_std::allocator<double>_>::~vector(&local_38);
  CEDate::GregorianVect(&local_158,&local_130);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_198,"test_Gregorian",(allocator *)&local_178);
  local_1a8 = (double)CONCAT44(local_1a8._4_4_,0x8d);
  CETestSuite::test_vect((vector *)this,(vector *)&local_158,(string *)&local_170,(int *)&local_198)
  ;
  std::__cxx11::string::~string((string *)&local_198);
  __gnu_cxx::new_allocator<char>::~new_allocator((new_allocator<char> *)&local_178);
  std::vector<double,_std::allocator<double>_>::~vector(&local_158);
  CEDate::GregorianVect(&local_198,this_01);
  std::vector<double,_std::allocator<double>_>::operator=(&local_170,&local_198);
  std::vector<double,_std::allocator<double>_>::~vector(&local_198);
  std::vector<double,_std::allocator<double>_>::vector(&local_158,&local_170);
  pvVar3 = std::vector<double,_std::allocator<double>_>::operator[](&local_158,0);
  *pvVar3 = -50000.0;
  std::vector<double,_std::allocator<double>_>::vector(&local_50,&local_158);
  local_1a8 = CEDate::GregorianVect2JD(&local_50);
  local_178 = 0.0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_198,"test_Gregorian",(allocator *)&local_1a0);
  local_140._0_4_ = 0x94;
  (**(code **)(*(long *)this + 0x58))(this,&local_1a8,&local_178,&local_198);
  std::__cxx11::string::~string((string *)&local_198);
  __gnu_cxx::new_allocator<char>::~new_allocator((new_allocator<char> *)&local_1a0);
  std::vector<double,_std::allocator<double>_>::~vector(&local_50);
  std::vector<double,_std::allocator<double>_>::operator=(&local_158,&local_170);
  pvVar3 = std::vector<double,_std::allocator<double>_>::operator[](&local_158,1);
  *pvVar3 = -1.0;
  std::vector<double,_std::allocator<double>_>::vector(&local_68,&local_158);
  local_1a8 = CEDate::GregorianVect2JD(&local_68);
  local_178 = 0.0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_198,"test_Gregorian",(allocator *)&local_1a0);
  local_140._0_4_ = 0x98;
  (**(code **)(*(long *)this + 0x58))(this,&local_1a8,&local_178,&local_198);
  std::__cxx11::string::~string((string *)&local_198);
  __gnu_cxx::new_allocator<char>::~new_allocator((new_allocator<char> *)&local_1a0);
  std::vector<double,_std::allocator<double>_>::~vector(&local_68);
  pvVar3 = std::vector<double,_std::allocator<double>_>::operator[](&local_158,1);
  *pvVar3 = 13.0;
  std::vector<double,_std::allocator<double>_>::vector(&local_80,&local_158);
  local_1a8 = CEDate::GregorianVect2JD(&local_80);
  local_178 = 0.0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_198,"test_Gregorian",(allocator *)&local_1a0);
  local_140._0_4_ = 0x9a;
  (**(code **)(*(long *)this + 0x58))(this,&local_1a8,&local_178,&local_198);
  std::__cxx11::string::~string((string *)&local_198);
  __gnu_cxx::new_allocator<char>::~new_allocator((new_allocator<char> *)&local_1a0);
  std::vector<double,_std::allocator<double>_>::~vector(&local_80);
  std::vector<double,_std::allocator<double>_>::operator=(&local_158,&local_170);
  pvVar3 = std::vector<double,_std::allocator<double>_>::operator[](&local_158,2);
  *pvVar3 = *pvVar3 + 100.0;
  std::vector<double,_std::allocator<double>_>::vector(&local_98,&local_158);
  local_1a8 = CEDate::GregorianVect2JD(&local_98);
  local_178 = CEDate::JD(this_01);
  local_178 = local_178 + 100.0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_198,"test_Gregorian",(allocator *)&local_1a0);
  local_140 = CONCAT44(local_140._4_4_,0x9e);
  (**(code **)(*(long *)this + 0x58))(this,&local_1a8,&local_178,&local_198);
  std::__cxx11::string::~string((string *)&local_198);
  __gnu_cxx::new_allocator<char>::~new_allocator((new_allocator<char> *)&local_1a0);
  std::vector<double,_std::allocator<double>_>::~vector(&local_98);
  local_198.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x3ff0000000000000;
  uStack_180 = 0x3fe0000000000000;
  local_198.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x409f400000000000;
  local_198.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x3ff0000000000000;
  __l._M_len = 4;
  __l._M_array = (iterator)&local_198;
  std::vector<double,_std::allocator<double>_>::operator=(&local_170,__l);
  local_1a8 = CppEphem::julian_date_J2000();
  local_178 = local_1a8 + -2400000.5;
  local_140 = 0x417312d658000000;
  std::vector<double,_std::allocator<double>_>::vector(&local_b0,&local_170);
  local_1a0 = CEDate::GregorianVect2JD(&local_b0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_198,"test_Gregorian",&local_1a9);
  local_134 = 0xa5;
  (**(code **)(*(long *)this + 0x58))(this,&local_1a0,&local_1a8,&local_198);
  std::__cxx11::string::~string((string *)&local_198);
  __gnu_cxx::new_allocator<char>::~new_allocator((new_allocator<char> *)&local_1a9);
  std::vector<double,_std::allocator<double>_>::~vector(&local_b0);
  std::vector<double,_std::allocator<double>_>::vector(&local_c8,&local_170);
  local_1a0 = CEDate::GregorianVect2MJD(&local_c8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_198,"test_Gregorian",&local_1a9);
  local_134 = 0xa6;
  (**(code **)(*(long *)this + 0x58))(this,&local_1a0,&local_178,&local_198);
  std::__cxx11::string::~string((string *)&local_198);
  __gnu_cxx::new_allocator<char>::~new_allocator((new_allocator<char> *)&local_1a9);
  std::vector<double,_std::allocator<double>_>::~vector(&local_c8);
  std::vector<double,_std::allocator<double>_>::vector(&local_e0,&local_170);
  local_1a0 = CEDate::GregorianVect2Gregorian(&local_e0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_198,"test_Gregorian",&local_1a9);
  local_134 = 0xa7;
  (**(code **)(*(long *)this + 0x58))(this,&local_1a0,&local_140,&local_198);
  std::__cxx11::string::~string((string *)&local_198);
  __gnu_cxx::new_allocator<char>::~new_allocator((new_allocator<char> *)&local_1a9);
  std::vector<double,_std::allocator<double>_>::~vector(&local_e0);
  uVar1 = (**(code **)(*(long *)this + 0x18))(this);
  std::vector<double,_std::allocator<double>_>::~vector(&local_158);
  CEDate::~CEDate(&local_130);
  std::vector<double,_std::allocator<double>_>::~vector(&local_170);
  return (bool)uVar1;
}

Assistant:

bool test_CEDate::test_Gregorian()
{
    test_date_.SetDate(base_date_.Gregorian(), CEDateType::GREGORIAN);
    test_double(test_date_.Gregorian(), base_date_.Gregorian(), __func__, __LINE__);

    // Test getting the year, month, day, and day fraction
    test_int(test_date_.Year(), base_date_.Year(), __func__, __LINE__);
    test_int(test_date_.Month(), base_date_.Month(), __func__, __LINE__);
    test_int(test_date_.Day(), base_date_.Day(), __func__, __LINE__);
    test_double(test_date_.DayFraction(), base_date_.DayFraction(), __func__, __LINE__);

    // Test getting the Gregorian date as a vector
    test_vect(test_date_.GregorianVect(), base_date_.GregorianVect(), __func__, __LINE__);

    // Test setting the date as a gregorian vector
    std::vector<double> greg_vec = base_date_.GregorianVect();
    CEDate test1;
    test(test1.JD() != base_date_.JD(), __func__, __LINE__);
    test1.SetDate(greg_vec);
    test_vect(test1.GregorianVect(), greg_vec, __func__, __LINE__);

    // Make sure that the returned errors of GregorianVect2JD are handled
    greg_vec                      = base_date_.GregorianVect();
    std::vector<double> greg_vec2 = greg_vec;
    // Test invalid year
    greg_vec2[0] = -50000;
    test_double(CEDate::GregorianVect2JD(greg_vec2), 0.0, __func__, __LINE__);
    greg_vec2 = greg_vec;
    // Test invalid month
    greg_vec2[1] = -1;
    test_double(CEDate::GregorianVect2JD(greg_vec2), 0.0, __func__, __LINE__);
    greg_vec2[1] = 13;
    test_double(CEDate::GregorianVect2JD(greg_vec2), 0.0, __func__, __LINE__);
    greg_vec2 = greg_vec;
    // Test date
    greg_vec2[2] += 100;
    test_double(CEDate::GregorianVect2JD(greg_vec2), base_date_.JD() + 100.0, __func__, __LINE__);

    // Test conversion of gregorian vector to JD, MJD, Gregorian date
    greg_vec = {2000, 01, 01, 0.5};
    double test_jd   = CppEphem::julian_date_J2000();
    double test_mjd  = test_jd - DJM0;
    double test_greg = 20000101.5;
    test_double(CEDate::GregorianVect2JD(greg_vec), test_jd, __func__, __LINE__);
    test_double(CEDate::GregorianVect2MJD(greg_vec), test_mjd, __func__, __LINE__);
    test_double(CEDate::GregorianVect2Gregorian(greg_vec), test_greg, __func__, __LINE__);

    return pass();
}